

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<float,true>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  float fVar1;
  float *pfVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  BOOL BVar8;
  ArrayBufferBase *pAVar9;
  undefined4 *puVar10;
  JavascriptLibrary *this_00;
  TypedArrayBase *pTVar11;
  uint local_3c;
  float compare;
  uint i;
  float currentRes;
  uint len;
  float *typedBuffer;
  bool findMax_local;
  ScriptContext *scriptContext_local;
  TypedArrayBase *this_local;
  
  pfVar2 = (float *)this->buffer;
  uVar5 = ArrayObject::GetLength((ArrayObject *)this);
  uVar6 = GetByteOffset(this);
  pAVar9 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
  uVar7 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar6 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  compare = *pfVar2;
  local_3c = 0;
  do {
    if (uVar5 <= local_3c) {
      pTVar11 = (TypedArrayBase *)JavascriptNumber::ToVarNoCheck((double)compare,scriptContext);
      return pTVar11;
    }
    uVar6 = GetByteOffset(this);
    pAVar9 = ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
    uVar7 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar7 < (ulong)(local_3c + 1) * 4 + (ulong)uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x9ec,
                                  "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    fVar1 = pfVar2[local_3c];
    BVar8 = JavascriptNumber::IsNan((double)fVar1);
    if (BVar8 != 0) {
      this_00 = ScriptContext::GetLibrary(scriptContext);
      pTVar11 = (TypedArrayBase *)
                JavascriptLibraryBase::GetNaN(&this_00->super_JavascriptLibraryBase);
      return pTVar11;
    }
    if (findMax) {
      if (compare < fVar1) {
LAB_013a4d89:
        compare = fVar1;
      }
    }
    else if ((fVar1 < compare) ||
            (((fVar1 == 0.0 && (!NAN(fVar1))) &&
             (BVar8 = JavascriptNumber::IsNegZero((double)compare), BVar8 != 0))))
    goto LAB_013a4d89;
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }